

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O3

void __thiscall kj::Vector<int>::setCapacity(Vector<int> *this,size_t newSize)

{
  int *piVar1;
  int *piVar2;
  RemoveConst<int> *pRVar3;
  ulong __n;
  ArrayBuilder<int> local_38;
  
  piVar1 = (this->builder).ptr;
  if (newSize < (ulong)((long)(this->builder).pos - (long)piVar1 >> 2)) {
    (this->builder).pos = piVar1 + newSize;
  }
  local_38.pos = (RemoveConst<int> *)
                 kj::_::HeapArrayDisposer::allocateImpl
                           (4,0,newSize,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  local_38.endPtr = local_38.pos + newSize;
  local_38.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  piVar1 = (this->builder).ptr;
  piVar2 = (this->builder).pos;
  local_38.ptr = local_38.pos;
  if (piVar1 != piVar2) {
    __n = (long)piVar2 - (long)piVar1 & 0xfffffffffffffffc;
    memcpy(local_38.pos,piVar1,__n);
    local_38.pos = (RemoveConst<int> *)((long)local_38.pos + __n);
  }
  ArrayBuilder<int>::operator=(&this->builder,&local_38);
  piVar2 = local_38.endPtr;
  pRVar3 = local_38.pos;
  piVar1 = local_38.ptr;
  if (local_38.ptr != (int *)0x0) {
    local_38.ptr = (int *)0x0;
    local_38.pos = (RemoveConst<int> *)0x0;
    local_38.endPtr = (int *)0x0;
    (**(local_38.disposer)->_vptr_ArrayDisposer)
              (local_38.disposer,piVar1,4,(long)pRVar3 - (long)piVar1 >> 2,
               (long)piVar2 - (long)piVar1 >> 2,0);
  }
  return;
}

Assistant:

void setCapacity(size_t newSize) {
    if (builder.size() > newSize) {
      builder.truncate(newSize);
    }
    ArrayBuilder<T> newBuilder = heapArrayBuilder<T>(newSize);
    newBuilder.addAll(kj::mv(builder));
    builder = kj::mv(newBuilder);
  }